

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O0

edge_id __thiscall TreePropagator::findEdge(TreePropagator *this,int u,int v,int idx)

{
  reference pvVar1;
  reference pvVar2;
  size_type sVar3;
  reference pvVar4;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int tmp;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_4;
  
  local_18 = in_EDX;
  local_14 = in_ESI;
  if (in_EDX < in_ESI) {
    local_18 = in_ESI;
    local_14 = in_EDX;
  }
  pvVar1 = std::
           vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
           ::operator[]((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                         *)(in_RDI + 0x80),(long)local_14);
  pvVar2 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::operator[](pvVar1,(long)local_18);
  sVar3 = std::vector<int,_std::allocator<int>_>::size(pvVar2);
  if (in_ECX < (int)sVar3) {
    pvVar1 = std::
             vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
             ::operator[]((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                           *)(in_RDI + 0x80),(long)local_14);
    pvVar2 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](pvVar1,(long)local_18);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)in_ECX);
    local_4 = *pvVar4;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

edge_id TreePropagator::findEdge(int u, int v, int idx) {
	if (u > v) {  // If I only read one, I only need to update one...
		const int tmp = u;
		u = v;
		v = tmp;
	}
	if (static_cast<int>(nodes2edge[u][v].size()) <= idx) {
		return -1;
	}
	return nodes2edge[u][v][idx];
}